

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  ostream *poVar4;
  istream *piVar5;
  long lVar6;
  char *pcVar7;
  allocator local_291;
  char **local_290;
  long local_288;
  long local_280;
  string line;
  string local_258;
  ifstream in;
  
  local_290 = argv;
  std::operator<<((ostream *)&std::cout,
                  "#include \"google/protobuf/compiler/js/well_known_types_embed.h\"\n");
  std::operator<<((ostream *)&std::cout,"struct FileToc well_known_types_js[] = {\n");
  local_288 = (long)argc;
  lVar6 = 1;
  while( true ) {
    if (local_288 <= lVar6) {
      std::operator<<((ostream *)&std::cout,"  {NULL, NULL}  // Terminate the list.\n");
      std::operator<<((ostream *)&std::cout,"};\n");
      return 0;
    }
    pcVar3 = local_290[lVar6];
    local_280 = lVar6;
    std::ifstream::ifstream((istream *)&in,pcVar3,_S_in);
    cVar2 = std::__basic_file<char>::is_open();
    pcVar1 = pcVar3;
    if (cVar2 == '\0') break;
    do {
      do {
        pcVar7 = pcVar3;
        pcVar3 = pcVar1 + 1;
        cVar2 = *pcVar1;
        pcVar1 = pcVar3;
      } while (cVar2 == '/');
      pcVar3 = pcVar7;
    } while (cVar2 != '\0');
    poVar4 = std::operator<<((ostream *)&std::cout,"{\"");
    std::__cxx11::string::string((string *)&local_258,pcVar7,&local_291);
    CEscape(&line,&local_258);
    poVar4 = std::operator<<(poVar4,(string *)&line);
    std::operator<<(poVar4,"\",\n");
    std::__cxx11::string::~string((string *)&line);
    std::__cxx11::string::~string((string *)&local_258);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&in,(string *)&line),
          ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"  \"");
      CEscape(&local_258,&line);
      poVar4 = std::operator<<(poVar4,(string *)&local_258);
      std::operator<<(poVar4,"\\n\"\n");
      std::__cxx11::string::~string((string *)&local_258);
    }
    std::__cxx11::string::~string((string *)&line);
    std::operator<<((ostream *)&std::cout,"},\n");
    std::ifstream::~ifstream((istream *)&in);
    lVar6 = local_280 + 1;
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Couldn\'t open input file: ");
  poVar4 = std::operator<<(poVar4,pcVar3);
  std::operator<<(poVar4,"\n");
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
  std::cout << "#include "
               "\"google/protobuf/compiler/js/well_known_types_embed.h\"\n";
  std::cout << "struct FileToc well_known_types_js[] = {\n";

  for (int i = 1; i < argc; i++) {
    AddFile(argv[i], &std::cout);
  }

  std::cout << "  {NULL, NULL}  // Terminate the list.\n";
  std::cout << "};\n";

  return EXIT_SUCCESS;
}